

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void kratos::DependencyVisitor::compute_linked_dep
               (VarSlice *slice,
               unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
               *linked_dep)

{
  int iVar1;
  unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>
  *puVar2;
  ulong uVar3;
  undefined4 extraout_var;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_kratos::Var_*>,_false,_false>,_bool>
  pVar4;
  uint local_54;
  Var *pVStack_50;
  uint32_t i_1;
  Var *p;
  VarVarSlice *var_slice;
  undefined1 local_38;
  uint local_2c;
  key_type pVStack_28;
  uint32_t i;
  Var *root;
  uint32_t var_low;
  uint32_t var_high;
  unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
  *linked_dep_local;
  VarSlice *slice_local;
  
  _var_low = linked_dep;
  linked_dep_local =
       (unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
        *)slice;
  root._4_4_ = (*(slice->super_Var).super_IRNode._vptr_IRNode[0x25])();
  root._0_4_ = (*(code *)(linked_dep_local->_M_h)._M_buckets[0x26])();
  pVStack_28 = (key_type)(*(code *)(linked_dep_local->_M_h)._M_buckets[0x29])();
  for (local_2c = (uint)root; local_2c <= root._4_4_; local_2c = local_2c + 1) {
    puVar2 = (unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>
              *)std::
                unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
                ::operator[](_var_low,&stack0xffffffffffffffd8);
    pVar4 = std::
            unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>
            ::emplace<unsigned_int&,kratos::VarSlice*&>
                      (puVar2,&local_2c,(VarSlice **)&linked_dep_local);
    var_slice = (VarVarSlice *)
                pVar4.first.
                super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>.
                _M_cur;
    local_38 = pVar4.second;
  }
  uVar3 = (*(code *)(linked_dep_local->_M_h)._M_buckets[0x2b])();
  if ((uVar3 & 1) != 0) {
    p = (Var *)linked_dep_local;
    pVStack_50 = VarVarSlice::sliced_var((VarVarSlice *)linked_dep_local);
    root._4_4_ = (*(pVStack_50->super_IRNode)._vptr_IRNode[0x25])();
    root._0_4_ = (*(pVStack_50->super_IRNode)._vptr_IRNode[0x26])();
    iVar1 = (*(pVStack_50->super_IRNode)._vptr_IRNode[0x29])();
    pVStack_28 = (key_type)CONCAT44(extraout_var,iVar1);
    for (local_54 = (uint)root; local_54 <= root._4_4_; local_54 = local_54 + 1) {
      puVar2 = (unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>
                *)std::
                  unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
                  ::operator[](_var_low,&stack0xffffffffffffffd8);
      std::
      unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>
      ::emplace<unsigned_int&,kratos::VarSlice*&>(puVar2,&local_54,(VarSlice **)&linked_dep_local);
    }
  }
  return;
}

Assistant:

static void compute_linked_dep(
        VarSlice *slice,
        std::unordered_map<const Var *, std::unordered_map<uint32_t, Var *>> &linked_dep) {
        auto var_high = slice->var_high();
        auto var_low = slice->var_low();
        auto *root = slice->get_var_root_parent();
        for (uint32_t i = var_low; i <= var_high; i++) {
            linked_dep[root].emplace(i, slice);
        }
        // if indexed by a var
        if (slice->sliced_by_var()) {
            auto *var_slice = reinterpret_cast<VarVarSlice *>(slice);
            auto *p = var_slice->sliced_var();
            var_high = p->var_high();
            var_low = p->var_low();
            root = p->get_var_root_parent();
            for (uint32_t i = var_low; i <= var_high; i++) {
                linked_dep[root].emplace(i, slice);
            }
        }
    }